

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HJNN.cpp
# Opt level: O1

void __thiscall HJNN::backward(HJNN *this)

{
  ofstream *this_00;
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  pointer pLVar4;
  double *pdVar5;
  undefined1 *puVar6;
  double *pdVar7;
  VectorXd *pVVar8;
  pointer pMVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  pointer this_01;
  undefined8 uVar14;
  undefined8 uVar15;
  Index size;
  ostream *poVar16;
  ostream *poVar17;
  ostream *poVar18;
  char *pcVar19;
  Index index;
  ulong uVar20;
  uint uVar21;
  pointer pMVar22;
  Index index_1;
  long lVar23;
  long lVar24;
  long lVar25;
  double dVar26;
  ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
  temp;
  assign_op<double,_double> local_b9;
  ostream *local_b8;
  pointer local_b0;
  undefined1 local_a8 [56];
  pointer local_70;
  VectorXd *pVStack_68;
  long local_60;
  double local_58;
  VectorXd *local_50;
  void *local_40;
  double *local_38;
  
  if ((this->truthMinusOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows < 0) {
    pcVar19 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
    ;
LAB_0010ad78:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,pcVar19);
  }
  local_b0 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = (ostream *)
             (double)local_b0[-1].out.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows;
  Layer::derivative((Layer *)local_a8);
  uVar15 = local_a8._8_8_;
  uVar14 = local_a8._0_8_;
  if ((undefined1 *)
      (this->truthMinusOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != (undefined1 *)local_a8._8_8_) {
    pcVar19 = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
    ;
LAB_0010adae:
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x6e,pcVar19);
  }
  pLVar4 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = (this->truthMinusOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data;
  if ((undefined1 *)
      pLVar4[-1].backwardAccumulation.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_storage.m_rows != (undefined1 *)local_a8._8_8_) {
    if ((long)local_a8._8_8_ < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)&pLVar4[-1].backwardAccumulation,local_a8._8_8_
               ,local_a8._8_8_,1);
  }
  puVar6 = (undefined1 *)
           pLVar4[-1].backwardAccumulation.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (puVar6 != (undefined1 *)uVar15) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2d1,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
                 );
  }
  dVar26 = -2.0 / (double)local_b8;
  pdVar7 = pLVar4[-1].backwardAccumulation.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar20 = (long)puVar6 - ((long)puVar6 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)puVar6) {
    lVar23 = 0;
    do {
      pdVar2 = pdVar5 + lVar23;
      dVar12 = pdVar2[1];
      ppdVar3 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar14)->m_storage)
                 .m_data + lVar23;
      dVar13 = (double)ppdVar3[1];
      pdVar1 = pdVar7 + lVar23;
      *pdVar1 = *pdVar2 * dVar26 * (double)*ppdVar3;
      pdVar1[1] = dVar12 * dVar26 * dVar13;
      lVar23 = lVar23 + 2;
    } while (lVar23 < (long)uVar20);
  }
  if ((long)uVar20 < (long)puVar6) {
    do {
      pdVar7[uVar20] =
           pdVar5[uVar20] * dVar26 *
           (double)(&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar14)->
                     m_storage).m_data)[uVar20];
      uVar20 = uVar20 + 1;
    } while (puVar6 != (undefined1 *)uVar20);
  }
  free((void *)local_a8._0_8_);
  if (this->debug == true) {
    pLVar4 = local_b0 + -1;
    this_00 = &this->log;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"------round",0xb);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->rounddebug);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," start---------\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"[last layer]\ntruth=",0x13);
    poVar16 = Eigen::operator<<((ostream *)this_00,
                                (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->truth);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", output=",9);
    poVar16 = Eigen::operator<<(poVar16,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                        &pLVar4->out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,", last layer accum=",0x13);
    poVar16 = Eigen::operator<<(poVar16,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                        &(this->layers).
                                         super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                                         super__Vector_impl_data._M_finish[-1].backwardAccumulation)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  iVar11 = (int)((ulong)((long)(this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < iVar11 + -2) {
    local_b8 = (ostream *)&this->log;
    uVar20 = (ulong)(iVar11 - 1);
    do {
      uVar21 = (int)uVar20 - 1;
      uVar20 = (ulong)uVar21;
      pLVar4 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      pMVar22 = (this->weights).
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pMVar22[uVar20].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows !=
          *(Index *)((long)&pLVar4[uVar20 + 1].backwardAccumulation.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8)) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/Product.h"
                      ,0x61,
                      "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_70 = pMVar22 + uVar20;
      pVStack_68 = &pLVar4[uVar20 + 1].backwardAccumulation;
      Layer::derivative((Layer *)&local_40);
      local_a8._0_8_ = local_70;
      local_a8._8_8_ = pVStack_68;
      local_a8._16_8_ = (Layer *)&local_40;
      if ((double *)
          (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols != local_38) {
        pcVar19 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>, const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::ArrayWrapper<const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::ArrayWrapper<Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_0010adae;
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const>,Eigen::internal::assign_op<double,double>>
                (&(this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20].backwardAccumulation,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_a8,&local_b9);
      free(local_40);
      poVar16 = local_b8;
      if (this->debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_b8,"[layer",6);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,uVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] data\n",7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"accum from last layer=\n",0x17);
        poVar16 = Eigen::operator<<(poVar16,(DenseBase<Eigen::ArrayWrapper<const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                                             *)&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\nlayer ",7);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,uVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"deri=\n",6);
        Layer::derivative((Layer *)local_a8);
        poVar16 = Eigen::operator<<(poVar16,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                            local_a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
        free((void *)local_a8._0_8_);
      }
    } while (1 < (int)uVar21);
  }
  if (this->debug != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[delta weight and bias]\n",0x18);
  }
  pMVar22 = (this->weights).
            super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->weights).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar22) {
    local_b0 = (pointer)&this->log;
    poVar16 = (ostream *)0x0;
    do {
      poVar18 = poVar16 + 1;
      pLVar4 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar8 = *(VectorXd **)
                ((long)&pLVar4[(long)poVar18].backwardAccumulation.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8);
      local_b8 = poVar18;
      if ((long)pVVar8 < 0) goto LAB_0010ad63;
      local_a8._32_8_ = &pLVar4[(long)poVar18].backwardAccumulation;
      local_a8._24_8_ = this->learningRate;
      local_a8._48_8_ = &pLVar4[(long)poVar16].out;
      local_a8._8_8_ = pVVar8;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_70,
                 (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                  *)local_a8);
      puVar6 = (undefined1 *)
               pMVar22[(long)poVar16].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      if ((VectorXd *)puVar6 != pVStack_68) {
LAB_0010ad82:
        pcVar19 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, -1, -1>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
LAB_0010adec:
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2c6,pcVar19);
      }
      lVar23 = pMVar22[(long)poVar16].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      if (lVar23 != local_60) goto LAB_0010ad82;
      pdVar5 = pMVar22[(long)poVar16].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar23 = lVar23 * (long)puVar6;
      uVar20 = lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < lVar23) {
        lVar24 = 0;
        do {
          dVar26 = (pdVar5 + lVar24)[1];
          ppdVar3 = &(local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data + lVar24;
          dVar12 = (double)ppdVar3[1];
          pdVar5[lVar24] = pdVar5[lVar24] - (double)*ppdVar3;
          (pdVar5 + lVar24)[1] = dVar26 - dVar12;
          lVar24 = lVar24 + 2;
        } while (lVar24 < (long)uVar20);
      }
      if ((long)uVar20 < lVar23) {
        do {
          pdVar5[uVar20] =
               pdVar5[uVar20] -
               (double)(&(local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         ).m_storage.m_data)[uVar20];
          uVar20 = uVar20 + 1;
        } while (lVar23 - uVar20 != 0);
      }
      free(local_70);
      this_01 = local_b0;
      pLVar4 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = *(Index *)((long)&pLVar4[(long)poVar18].backwardAccumulation.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8)
      ;
      if ((long)uVar20 < 0) goto LAB_0010ad63;
      pMVar9 = (this->biases).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = pMVar9[(long)poVar16].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows;
      if (uVar10 != uVar20) {
        pcVar19 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
        goto LAB_0010adec;
      }
      dVar26 = this->learningRate;
      lVar23 = *(long *)&pLVar4[(long)poVar18].backwardAccumulation.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      lVar24 = (long)pMVar9[(long)poVar16].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      uVar20 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar10) {
        lVar25 = 0;
        do {
          pdVar5 = (double *)(lVar23 + lVar25 * 8);
          dVar12 = pdVar5[1];
          pdVar7 = (double *)(lVar24 + lVar25 * 8);
          dVar13 = pdVar7[1];
          pdVar1 = (double *)(lVar24 + lVar25 * 8);
          *pdVar1 = *pdVar7 - *pdVar5 * dVar26;
          pdVar1[1] = dVar13 - dVar12 * dVar26;
          lVar25 = lVar25 + 2;
        } while (lVar25 < (long)uVar20);
      }
      if ((long)uVar20 < (long)uVar10) {
        do {
          *(double *)(lVar24 + uVar20 * 8) =
               *(double *)(lVar24 + uVar20 * 8) - *(double *)(lVar23 + uVar20 * 8) * dVar26;
          uVar20 = uVar20 + 1;
        } while (uVar10 != uVar20);
      }
      if (this->debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,"delta weight",0xc);
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)this_01,(int)poVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"=\n",2);
        pLVar4 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVVar8 = *(VectorXd **)
                  ((long)&pLVar4[(long)poVar18].backwardAccumulation.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8);
        if (-1 < (long)pVVar8) {
          local_a8._32_8_ = &pLVar4[(long)poVar18].backwardAccumulation;
          local_a8._24_8_ = this->learningRate;
          local_a8._48_8_ = &pLVar4[(long)poVar16].out;
          local_a8._8_8_ = pVVar8;
          poVar17 = Eigen::operator<<(poVar17,(DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                                               *)local_a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\ndelta bias",0xb);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar17,(int)poVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"=\n",2);
          pLVar4 = (this->layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pVVar8 = *(VectorXd **)
                    ((long)&pLVar4[(long)poVar18].backwardAccumulation.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> + 8);
          if (-1 < (long)pVVar8) {
            local_50 = &pLVar4[(long)poVar18].backwardAccumulation;
            local_58 = this->learningRate;
            pVStack_68 = pVVar8;
            poVar16 = Eigen::operator<<(poVar16,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                 *)&local_70);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
            std::ostream::put((char)poVar16);
            std::ostream::flush();
            goto LAB_0010acb6;
          }
        }
LAB_0010ad63:
        pcVar19 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_0010ad78;
      }
LAB_0010acb6:
      pMVar22 = (this->weights).
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar18 = (ostream *)
                (((long)(this->weights).
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar22 >> 3) *
                -0x5555555555555555);
      poVar16 = local_b8;
    } while (local_b8 <= poVar18 && (long)poVar18 - (long)local_b8 != 0);
  }
  if (this->debug != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->log,"------round",0xb);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&this->log,this->rounddebug);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," end---------",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  return;
}

Assistant:

void HJNN::train(Eigen::MatrixXd data,Eigen::MatrixXd truths,double threshold,int maxRounds,double _learningRate){
	if(data.rows()!=layers[0].neuronNum){
		std::cerr<<"data dimension does not match the input neuron number of network! "<<std::endl;
		return;
	}
	lastLoss=0;
	lossIncreaseTime=0;
	if(debug){
		auto t = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
		std::stringstream ss;
		ss << std::put_time(std::localtime(&t), "%F %T");
		std::string str = "log_"+ss.str()+".txt";
		log.open(str);
	}

	int dataNum=data.cols();
	int rounds=0;
	learningRate=_learningRate;
	double loss=0;
	Eigen::ArrayXd lossList=Eigen::ArrayXd::Zero(dataNum);
	while(rounds<maxRounds){
		int index=rounds++%dataNum;
		rounddebug=rounds;
		//set input and truth
		layers[0].out=data.col(index);
		truth=truths.col(index);
		//do a round
		forward();
		loss=lossList(index)=calculateLoss();
		std::cout<<"round "<<rounds<<",loss "<<loss<<std::endl;
		if(loss>lastLoss&&loss>threshold){
			if(++lossIncreaseTime>10){
				std::cerr<<"loss continue increase, net probably will not converge, stop training!"<<std::endl;
				break;
			}
		}else lossIncreaseTime=0;
		lastLoss=loss;
		if(loss>1e100){
			std::cerr<<"loss is too large, net probably will not converge, stop training!"<<std::endl;
			break;
		}
//		if(loss>threshold)backward();
		backward();
		//if average loss is less than threshold then terminate training
//		if(index>=dataNum-1){
//			double avgLoss=lossList.sum()/dataNum<threshold;
//			if(avgLoss<threshold)break;
//			if(index==dataNum-1)std::cout<<"one iteration completed, average loss="<<avgLoss<<std::endl;
//		}
	}
	std::cout<<"Training completed! "<<rounds<<" rounds trained, average loss="<<lossList.sum()/dataNum<<std::endl;
	if(debug)log.close();
}